

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  anon_union_8_2_185e79b9_for_Zone_4 *targets;
  uint uVar1;
  int iVar2;
  BaseCompiler *pBVar3;
  BaseRAPass *pBVar4;
  BaseCompiler *pBVar5;
  undefined8 *puVar6;
  BaseBuilder *pBVar7;
  PhysToWorkMap *pPVar8;
  Slot *__src;
  BaseNode *pBVar9;
  ulong uVar10;
  Error EVar11;
  Error EVar12;
  uint32_t *puVar13;
  BaseCompiler *pBVar14;
  BaseCompiler *pBVar15;
  BaseCompiler *pBVar16;
  BaseRAPass *pBVar17;
  uint uVar18;
  BaseCompiler *pBVar19;
  FuncFrame *frame;
  EVP_PKEY_CTX *ctx;
  BaseCompiler *pBVar20;
  BaseCompiler *pBVar21;
  char cVar22;
  bool bVar23;
  RALocalAllocator lra;
  Error local_154;
  size_type local_148;
  BaseCompiler *local_140;
  undefined1 local_118 [16];
  ArchTraits *local_108;
  CodeHolder *local_100;
  Logger *pLStack_f8;
  ErrorHandler *local_f0;
  Environment EStack_e8;
  RAAssignment local_e0 [2];
  BaseCompiler *local_50;
  
  local_118._8_8_ = (this->super_FuncPass).super_Pass._cb;
  local_108 = this->_archTraits;
  local_100 = *(CodeHolder **)(this->_availableRegs)._masks;
  pLStack_f8 = *(Logger **)((this->_availableRegs)._masks + 2);
  ctx = (EVP_PKEY_CTX *)0x0;
  local_118._0_8_ = this;
  memset(&local_f0,0,0xc0);
  local_140 = (BaseCompiler *)local_118;
  EVar11 = RALocalAllocator::init((RALocalAllocator *)local_140,ctx);
  if ((EVar11 != 0) || (EVar11 = 0, (this->_blocks).super_ZoneVectorBase._size == 0)) {
    return EVar11;
  }
  if ((this->_blocks).super_ZoneVectorBase._size != 0) {
    pBVar20 = *(this->_blocks).super_ZoneVectorBase._data;
    pBVar16 = local_140;
    if (((pBVar20->super_BaseBuilder).super_BaseEmitter._encodingOptions & 2) == 0)
    goto LAB_00121566;
    local_148 = (this->_pov).super_ZoneVectorBase._size;
    RALocalAllocator::makeInitialAssignment((RALocalAllocator *)local_118);
    EVar11 = setBlockEntryAssignment(this,(RABlock *)pBVar20,(RABlock *)pBVar20,local_e0);
    if (EVar11 != 0) {
      return EVar11;
    }
    pBVar19 = (BaseCompiler *)0x0;
    local_154 = 0;
    while( true ) {
      pBVar16 = (BaseCompiler *)0x0;
      pBVar14 = *(BaseCompiler **)&(pBVar20->super_BaseBuilder).super_BaseEmitter._forcedInstOptions
      ;
      pBVar15 = *(BaseCompiler **)
                 ((RARegMask *)&(pBVar20->super_BaseBuilder).super_BaseEmitter._code)->_masks;
      uVar1 = (pBVar20->super_BaseBuilder).super_BaseEmitter._encodingOptions;
      pBVar3 = *(BaseCompiler **)&(pBVar15->super_BaseBuilder).super_BaseEmitter._emitterType;
      if ((uVar1 >> 8 & 1) == 0) {
        pBVar15 = pBVar16;
      }
      pBVar4 = (BaseRAPass *)(pBVar14->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter;
      local_140 = (BaseCompiler *)0x0;
      if (*(int *)&(pBVar20->super_BaseBuilder)._dataZone._ptr != 0) break;
LAB_00121147:
      (pBVar20->super_BaseBuilder).super_BaseEmitter._encodingOptions = uVar1 | 8;
      local_50 = pBVar20;
      if (pBVar14 == pBVar3) {
        bVar23 = false;
      }
      else {
        targets = &(pBVar20->super_BaseBuilder)._codeZone.field_3;
        bVar23 = false;
        do {
          pBVar16 = (BaseCompiler *)0x0;
          pBVar5 = *(BaseCompiler **)&(pBVar14->super_BaseBuilder).super_BaseEmitter._emitterType;
          if (((pBVar14->super_BaseBuilder).super_BaseEmitter._forcedInstOptions & 0x2000) == 0) {
            cVar22 = '\0';
            pBVar14 = pBVar5;
          }
          else {
            pBVar21 = pBVar14;
            if (pBVar14 == pBVar15) {
              if (((pBVar20->super_BaseBuilder).super_BaseEmitter._encodingOptions & 0x200) == 0) {
                if (*(uint *)&(pBVar20->super_BaseBuilder)._dataZone._ptr < 2) {
                  cVar22 = '\0';
                  bVar23 = true;
                }
                else {
                  EVar12 = RALocalAllocator::allocJumpTable
                                     ((RALocalAllocator *)local_118,(InstNode *)pBVar14,
                                      (RABlocks *)&targets->field_0,(RABlock *)0x0);
                  EVar11 = EVar12;
                  if (EVar12 == 0) {
                    pBVar21 = pBVar5;
                    EVar11 = local_154;
                  }
                  local_154 = EVar11;
                  cVar22 = (EVar12 == 0) * '\t' + '\x01';
                }
              }
              else {
                iVar2 = *(int *)&(pBVar20->super_BaseBuilder)._dataZone._ptr;
                if (iVar2 == 0) goto LAB_0012156b;
                puVar6 = (undefined8 *)targets->_packedData;
                EVar12 = RALocalAllocator::allocBranch
                                   ((RALocalAllocator *)local_118,(InstNode *)pBVar14,
                                    (RABlock *)puVar6[iVar2 - 1],(RABlock *)*puVar6);
                EVar11 = EVar12;
                if (EVar12 == 0) {
                  pBVar21 = pBVar5;
                  EVar11 = local_154;
                }
                local_154 = EVar11;
                cVar22 = (EVar12 == 0) * '\t' + '\x01';
              }
              EVar11 = local_154;
              if (cVar22 == '\0') goto LAB_00121198;
            }
            else {
LAB_00121198:
              EVar11 = RALocalAllocator::allocInst
                                 ((RALocalAllocator *)local_118,(InstNode *)pBVar14);
              cVar22 = '\x01';
              if (EVar11 == 0) {
                if ((char)(pBVar14->super_BaseBuilder).super_BaseEmitter._forcedInstOptions ==
                    '\x12') {
                  EVar11 = (*(this->super_FuncPass).super_Pass._vptr_Pass[0xe])(this,pBVar14);
                }
                else {
                  EVar11 = RALocalAllocator::spillAfterAllocation
                                     ((RALocalAllocator *)local_118,(InstNode *)pBVar14);
                }
                if (EVar11 == 0) {
                  cVar22 = '\0';
                  EVar11 = local_154;
                }
              }
            }
            local_154 = EVar11;
            pBVar14 = pBVar21;
            if (cVar22 == '\0') {
              pBVar14 = pBVar5;
            }
          }
          if ((cVar22 != '\n') && (cVar22 != '\0')) goto LAB_001214c2;
        } while (pBVar14 != pBVar3);
      }
      if (local_140 == (BaseCompiler *)0x0) {
LAB_00121408:
        pBVar16 = (BaseCompiler *)0x0;
        *(BaseBuilder **)&(pBVar20->super_BaseBuilder).super_BaseEmitter._forcedInstOptions =
             (pBVar4->super_FuncPass).super_Pass._cb;
        pBVar14 = (BaseCompiler *)&((this->super_FuncPass).super_Pass._cb)->_lastNode;
        if (pBVar3 != (BaseCompiler *)0x0) {
          pBVar14 = pBVar3;
        }
        *(BaseRAPass **)((RARegMask *)&(pBVar20->super_BaseBuilder).super_BaseEmitter._code)->_masks
             = (BaseRAPass *)(pBVar14->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter;
        local_148 = local_148 - 1;
        if (local_148 == 0) {
          local_148 = 0;
          cVar22 = '\b';
        }
        else if ((local_140 == (BaseCompiler *)0x0) ||
                (cVar22 = '\t', pBVar20 = local_140,
                ((local_140->super_BaseBuilder).super_BaseEmitter._encodingOptions & 8) != 0)) {
          uVar1 = (this->_blocks).super_ZoneVectorBase._size;
          uVar18 = (int)pBVar19 + 1;
          pBVar19 = (BaseCompiler *)(ulong)uVar18;
          if (uVar1 <= uVar18) {
            pBVar19 = pBVar16;
          }
          if (uVar1 <= (uint)pBVar19) {
            runLocalAllocator();
            goto LAB_00121557;
          }
          while( true ) {
            pBVar20 = *(BaseCompiler **)
                       ((long)(this->_blocks).super_ZoneVectorBase._data + (long)pBVar19 * 8);
            if ((((pBVar20->super_BaseBuilder).super_BaseEmitter._encodingOptions & 10) == 2) &&
               (pPVar8 = (PhysToWorkMap *)(pBVar20->super_BaseBuilder)._allocator._slots[2],
               pPVar8 != (PhysToWorkMap *)0x0)) break;
            uVar18 = (int)pBVar19 + 1;
            pBVar19 = (BaseCompiler *)(ulong)uVar18;
            if (uVar1 <= uVar18) {
              pBVar19 = pBVar16;
            }
          }
          RALocalAllocator::replaceAssignment
                    ((RALocalAllocator *)local_118,pPVar8,
                     (WorkToPhysMap *)(pBVar20->super_BaseBuilder)._allocator._slots[3]);
          cVar22 = '\0';
        }
      }
      else {
        pBVar7 = (this->super_FuncPass).super_Pass._cb;
        pBVar16 = (BaseCompiler *)&pBVar7->_lastNode;
        if (pBVar3 != (BaseCompiler *)0x0) {
          pBVar16 = pBVar3;
        }
        pBVar17 = (BaseRAPass *)(pBVar16->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter;
        if (bVar23) {
          pBVar17 = (BaseRAPass *)(pBVar17->super_FuncPass).super_Pass._vptr_Pass;
        }
        pBVar7->_cursor = (BaseNode *)pBVar17;
        pPVar8 = (PhysToWorkMap *)(local_140->super_BaseBuilder)._allocator._slots[2];
        if (pPVar8 == (PhysToWorkMap *)0x0) {
          uVar1 = *(uint *)(local_140->super_BaseBuilder)._allocator._slots;
          if ((ulong)uVar1 == 0xffffffff) {
            puVar13 = (uint32_t *)((long)(local_140->super_BaseBuilder)._allocator._slots + 4);
LAB_001213ac:
            EVar11 = RALocalAllocator::spillScratchGpRegsBeforeEntry
                               ((RALocalAllocator *)local_118,*puVar13);
            if ((EVar11 == 0) &&
               (EVar11 = setBlockEntryAssignment
                                   (this,(RABlock *)local_140,(RABlock *)pBVar20,local_e0),
               EVar11 == 0)) {
              __src = (local_140->super_BaseBuilder)._allocator._slots[3];
              memcpy(local_e0[0]._physToWorkMap,(local_140->super_BaseBuilder)._allocator._slots[2],
                     (ulong)local_e0[0]._layout.physTotal * 4 + 0x20);
              memcpy(local_e0[0]._workToPhysMap,__src,(ulong)local_e0[0]._layout.workCount);
              bVar23 = true;
            }
            else {
              local_154 = EVar11;
              bVar23 = false;
            }
            goto LAB_001213f0;
          }
          pBVar17 = (BaseRAPass *)(local_140->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter
          ;
          if (uVar1 < (pBVar17->_sharedAssignments).super_ZoneVectorBase._size) {
            puVar13 = (uint32_t *)
                      ((ulong)uVar1 * 0x28 +
                      (long)(pBVar17->_sharedAssignments).super_ZoneVectorBase._data);
            goto LAB_001213ac;
          }
          goto LAB_0012155c;
        }
        EVar11 = RALocalAllocator::switchToAssignment
                           ((RALocalAllocator *)local_118,pPVar8,
                            (WorkToPhysMap *)(local_140->super_BaseBuilder)._allocator._slots[3],
                            (ZoneBitVector *)&(local_140->super_BaseBuilder)._dataZone._end,
                            SUB41(((local_140->super_BaseBuilder).super_BaseEmitter._encodingOptions
                                  & 8) >> 3,0),false);
        bVar23 = EVar11 == 0;
        if (!bVar23) {
          local_154 = EVar11;
        }
LAB_001213f0:
        cVar22 = '\x01';
        if (bVar23) goto LAB_00121408;
      }
LAB_001214c2:
      if ((cVar22 != '\0') && (cVar22 != '\t')) {
        if (cVar22 != '\b') {
          return local_154;
        }
        uVar10 = *(ulong *)((this->_clobberedRegs)._masks + 2);
        *(ulong *)(this->_clobberedRegs)._masks =
             (ulong)local_f0 | *(ulong *)(this->_clobberedRegs)._masks;
        *(ulong *)((this->_clobberedRegs)._masks + 2) = (ulong)EStack_e8 | uVar10;
        return 0;
      }
    }
    if (*(int *)&(pBVar20->super_BaseBuilder)._dataZone._ptr != 0) {
      local_140 = *(BaseCompiler **)(pBVar20->super_BaseBuilder)._codeZone.field_3;
      goto LAB_00121147;
    }
LAB_00121557:
    runLocalAllocator();
    local_140 = pBVar16;
LAB_0012155c:
    runLocalAllocator();
  }
  runLocalAllocator();
  pBVar16 = local_140;
LAB_00121566:
  runLocalAllocator();
LAB_0012156b:
  runLocalAllocator();
  pBVar20 = *(BaseCompiler **)&(pBVar16->super_BaseBuilder).super_BaseEmitter._emitterType;
  pBVar9 = (BaseNode *)(pBVar16->super_BaseBuilder)._passZone._end;
  (pBVar20->super_BaseBuilder)._cursor = pBVar9;
  frame = (FuncFrame *)((long)&pBVar9[9].field_3._userDataU64 + 4);
  EVar11 = BaseEmitter::emitProlog((BaseEmitter *)pBVar20,frame);
  if ((EVar11 == 0) &&
     (EVar11 = BaseEmitHelper::emitArgsAssignment
                         ((BaseEmitHelper *)(pBVar16->super_BaseBuilder)._dataZone._end,frame,
                          (FuncArgsAssignment *)
                          &pBVar16[1].super_BaseBuilder._codeZone.field_3.field_0), EVar11 == 0)) {
    pBVar20 = *(BaseCompiler **)&(pBVar16->super_BaseBuilder).super_BaseEmitter._emitterType;
    (pBVar20->super_BaseBuilder)._cursor =
         *(BaseNode **)((pBVar16->super_BaseBuilder)._passZone._end + 0x230);
    EVar11 = BaseEmitter::emitEpilog((BaseEmitter *)pBVar20,frame);
  }
  return EVar11;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however,
  // the algorithm also allows to jump to any other block when finished if it's
  // a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == BaseNode::kNodeInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(
          lra.switchToAssignment(
            consecutive->entryPhysToWorkMap(),
            consecutive->entryWorkToPhysMap(),
            consecutive->liveIn(),
            consecutive->isAllocated(),
            false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap(), consecutive->entryWorkToPhysMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap(), block->entryWorkToPhysMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}